

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

pboolean p_socket_shutdown(PSocket *socket,pboolean shutdown_read,pboolean shutdown_write,
                          PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint pVar3;
  PErrorIO code;
  uint local_2c;
  pint how;
  PError **error_local;
  pboolean shutdown_write_local;
  pboolean shutdown_read_local;
  PSocket *socket_local;
  
  if (socket == (PSocket *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    socket_local._4_4_ = 0;
  }
  else {
    pVar1 = pp_socket_check(socket,error);
    if (pVar1 == 0) {
      socket_local._4_4_ = 0;
    }
    else if (shutdown_read == 0 && shutdown_write == 0) {
      socket_local._4_4_ = 1;
    }
    else {
      if ((shutdown_read == 1) && (shutdown_write == 1)) {
        local_2c = 2;
      }
      else {
        local_2c = (uint)(shutdown_read != 1);
      }
      iVar2 = shutdown(socket->fd,local_2c);
      if (iVar2 == 0) {
        if ((shutdown_read == 1) && (shutdown_write == 1)) {
          socket->field_0x18 = socket->field_0x18 & 0xf7;
        }
        socket_local._4_4_ = 1;
      }
      else {
        pVar3 = p_error_get_last_net();
        code = p_error_get_io_from_system(pVar3);
        pVar3 = p_error_get_last_net();
        p_error_set_error_p(error,code,pVar3,"Failed to call shutdown() on socket");
        socket_local._4_4_ = 0;
      }
    }
  }
  return socket_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_shutdown (PSocket	*socket,
		   pboolean	shutdown_read,
		   pboolean	shutdown_write,
		   PError	**error)
{
	pint how;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (shutdown_read == FALSE && shutdown_write == FALSE))
		return TRUE;

#ifndef P_OS_WIN
	if (shutdown_read == TRUE && shutdown_write == TRUE)
		how = SHUT_RDWR;
	else if (shutdown_read == TRUE)
		how = SHUT_RD;
	else
		how = SHUT_WR;
#else
	if (shutdown_read == TRUE && shutdown_write == TRUE)
		how = SD_BOTH;
	else if (shutdown_read == TRUE)
		how = SD_RECEIVE;
	else
		how = SD_SEND;
#endif

	if (P_UNLIKELY (shutdown (socket->fd, how) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call shutdown() on socket");
		return FALSE;
	}

	if (shutdown_read == TRUE && shutdown_write == TRUE)
		socket->connected = FALSE;

	return TRUE;
}